

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O1

optional<unsigned_long> __thiscall
cappuccino::
ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::find(ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  time_point now;
  iterator iVar2;
  undefined8 uVar3;
  undefined8 unaff_RBP;
  ulong uVar4;
  optional<unsigned_long> oVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    do_prune(this,now);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::keyed_element>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::keyed_element>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::keyed_element>_>_>
            ::find(&(this->m_keyed_elements)._M_t,key);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->m_keyed_elements)._M_t._M_impl.super__Rb_tree_header) {
      uVar4 = 0;
    }
    else {
      key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((_Storage<unsigned_long,_true> *)(iVar2._M_node + 2))->_M_value;
      uVar4 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = uVar4 & 0xffffffff;
    oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)(_Storage<unsigned_long,_true>)key;
    return (optional<unsigned_long>)
           oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar3);
}

Assistant:

auto find(const key_type& key) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        const auto      now = std::chrono::steady_clock::now();

        do_prune(now);

        return do_find(key);
    }